

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.c
# Opt level: O2

double getVariableValue(char *key)

{
  variable *pvVar1;
  int iVar2;
  variable **ppvVar3;
  
  ppvVar3 = &variables_first;
  while( true ) {
    pvVar1 = *ppvVar3;
    if (pvVar1 == (variable *)0x0) {
      return 0.0;
    }
    iVar2 = strcmp(key,pvVar1->key);
    if (iVar2 == 0) break;
    ppvVar3 = &pvVar1->next;
  }
  return pvVar1->value;
}

Assistant:

double getVariableValue(const char *key)
{
    struct variable *var = variables_first;

    while (var != NULL) {
        if (!strcmp(key, var->key)) {
            return var->value;
        }

        var = var->next;
    }

    return 0;
}